

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.c
# Opt level: O1

int event_base_set(event_base *base,event *ev)

{
  int iVar1;
  
  iVar1 = -1;
  if ((ev->ev_evcallback).evcb_flags == 0x80) {
    event_debug_assert_is_setup_(ev);
    ev->ev_base = base;
    (ev->ev_evcallback).evcb_pri =
         (uint8_t)((uint)(base->nactivequeues - (base->nactivequeues >> 0x1f)) >> 1);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int
event_base_set(struct event_base *base, struct event *ev)
{
	/* Only innocent events may be assigned to a different base */
	if (ev->ev_flags != EVLIST_INIT)
		return (-1);

	event_debug_assert_is_setup_(ev);

	ev->ev_base = base;
	ev->ev_pri = base->nactivequeues/2;

	return (0);
}